

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool medit_gold(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  bool bVar3;
  char *txt;
  
  txt = "Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r";
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_lookup(argument,wealth_table);
    if (iVar2 != -99) {
      *(int *)((long)pvVar1 + 0x120) = iVar2;
      bVar3 = true;
      txt = "Wealth set.\n\r";
      goto LAB_0036204d;
    }
  }
  bVar3 = false;
LAB_0036204d:
  send_to_char(txt,ch);
  return bVar3;
}

Assistant:

bool medit_gold(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int index;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r", ch);
		return false;
	}

	index = flag_lookup(argument, wealth_table);

	if (index == NO_FLAG)
	{
		medit_gold(ch, "");
		return false;
	}

	pMob->wealth = index;
	send_to_char("Wealth set.\n\r", ch);
	return true;
}